

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O2

bool __thiscall features::Surf::descriptor_computation(Surf *this,Descriptor *descr,bool upright)

{
  Vector<float,_64> *this_00;
  element_type *peVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Vector<float,_64> *pVVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_68;
  float local_54;
  float local_50;
  float dy;
  float local_48;
  int local_44;
  float local_40;
  int local_3c;
  float local_38;
  float local_34;
  float dx;
  
  local_3c = (int)descr->scale;
  fVar7 = (float)(local_3c * 0xf + 1);
  if ((((fVar7 <= descr->x) && (fVar7 <= descr->y)) &&
      (peVar1 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      , descr->x + fVar7 < (float)(peVar1->super_TypedImageBase<long>).super_ImageBase.w)) &&
     (descr->y + fVar7 <= (float)(peVar1->super_TypedImageBase<long>).super_ImageBase.h)) {
    if (upright) {
      local_34 = 1.0;
      local_68 = 0.0;
    }
    else {
      local_68 = sinf(descr->orientation);
      local_34 = cosf(descr->orientation);
    }
    this_00 = &descr->data;
    local_38 = 0.0;
    math::Vector<float,_64>::fill(this_00,&local_38);
    local_40 = (float)local_3c;
    pVVar5 = this_00;
    for (iVar3 = -10; iVar3 != 10; iVar3 = iVar3 + 1) {
      local_48 = local_34 * ((float)iVar3 + 0.5);
      dy = ((float)iVar3 + 0.5) * -local_68;
      local_44 = iVar3 * iVar3;
      uVar4 = 0;
      iVar6 = -10;
      while( true ) {
        if (iVar6 == 10) break;
        fVar7 = (local_34 * ((float)iVar6 + 0.5) + dy) * local_40 + descr->x;
        if (fVar7 <= 0.0) {
          fVar7 = ceilf(fVar7 + -0.5);
        }
        else {
          fVar7 = floorf(fVar7 + 0.5);
        }
        fVar8 = (((float)iVar6 + 0.5) * local_68 + local_48) * local_40 + descr->y;
        if (fVar8 <= 0.0) {
          fVar8 = ceilf(fVar8 + -0.5);
        }
        else {
          fVar8 = floorf(fVar8 + 0.5);
        }
        filter_dx_dy(this,(int)fVar7,(int)fVar8,local_3c,&local_38,&local_54);
        fVar9 = local_34 * local_38 + local_68 * local_54;
        iVar2 = iVar6 * iVar6 + local_44;
        fVar8 = local_38 * -local_68 + local_54 * local_34;
        local_50 = 6.6;
        fVar7 = math::fastpow<float>(&local_50,2);
        fVar7 = expf(-(float)iVar2 / fVar7);
        pVVar5->v[0] = fVar7 * fVar9 + pVVar5->v[0];
        pVVar5->v[1] = fVar7 * fVar8 + pVVar5->v[1];
        pVVar5->v[2] = ABS(fVar9) * fVar7 + pVVar5->v[2];
        pVVar5->v[3] = ABS(fVar8) * fVar7 + pVVar5->v[3];
        pVVar5 = (Vector<float,_64> *)
                 (pVVar5->v + (ulong)((int)(uVar4 / 5) * -5 + -4 + iVar6 == -10) * 4);
        iVar6 = iVar6 + 1;
        uVar4 = (ulong)((int)uVar4 + 1);
      }
      pVVar5 = (Vector<float,_64> *)(pVVar5->v + (ulong)((iVar3 + 10U) % 5 == 4) * 0x10 + -0x10);
    }
    fVar7 = math::Vector<float,_64>::square_norm(this_00);
    if (1e-08 < ABS(fVar7)) {
      if (fVar7 < 0.0) {
        local_38 = sqrtf(fVar7);
      }
      else {
        local_38 = SQRT(fVar7);
      }
      math::Vector<float,_64>::operator/=(this_00,&local_38);
      return true;
    }
  }
  return false;
}

Assistant:

bool
Surf::descriptor_computation (Descriptor* descr, bool upright)
{
    int const descr_scale = static_cast<int>(descr->scale);
    int const width = this->sat->width();
    int const height = this->sat->height();

    /*
     * Size of the descriptor is 20s (10s to each side). The Wavelet filter
     * have size 2s (1s to each side), plus one additional pixel for simpler
     * integral image lookup. Since the window can be rotated, 4s additional
     * pixel are needed.
     */
    float const spacing = static_cast<float>(15 * descr_scale + 1);
    if (descr->x < spacing || descr->y < spacing
        || descr->x + spacing >= width || descr->y + spacing > height)
        return false;

    float sin_ori = 0.0f, cos_ori = 1.0f;
    if (!upright)
    {
        sin_ori = std::sin(descr->orientation);
        cos_ori = std::cos(descr->orientation);
    }

    /* Interest point region has size 20 * scale. */
    descr->data.fill(0.0f);
    float* descr_iter = &descr->data[0];
    for (int y = -10; y < 10; ++y)
    {
        for (int x = -10; x < 10; ++x)
        {
            /* Rotate sample coordinate. */
            int rot_x = static_cast<int>(math::round(descr->x
                + (cos_ori * (x + 0.5f) - sin_ori * (y + 0.5f))
                * descr_scale));
            int rot_y = static_cast<int>(math::round(descr->y
                + (sin_ori * (x + 0.5f) + cos_ori * (y + 0.5f))
                * descr_scale));

            /* Obtain and rotate gradient. */
            float dx, dy;
            this->filter_dx_dy(rot_x, rot_y, descr_scale, &dx, &dy);
            float ori_dx = cos_ori * dx + sin_ori * dy;
            float ori_dy = -sin_ori * dx + cos_ori * dy;

            /* Keypoints are weighted with a Gaussian, sigma = 3.3*s. */
            float weight = std::exp(-static_cast<float>(x * x + y * y)
                / math::fastpow(2.0f * 3.3f, 2));
            *(descr_iter++) += weight * ori_dx;
            *(descr_iter++) += weight * ori_dy;
            *(descr_iter++) += weight * std::abs(ori_dx);
            *(descr_iter++) += weight * std::abs(ori_dy);

            if ((x + 10) % 5 != 4)
                descr_iter -= 4;
        }
        if ((y + 10) % 5 != 4)
            descr_iter -= 4 * 4;
    }

    /* Normalize descriptor, reject too small descriptors. */
    float norm = descr->data.square_norm();
    if (MATH_EPSILON_EQ(norm, 0.0f, 1e-8))  // TODO: Play with this.
        return false;
    descr->data /= std::sqrt(norm);

    return true;
}